

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O2

bool __thiscall DiskTableNode::hasKey(DiskTableNode *this,longlong key)

{
  bool bVar1;
  IndexMap *pIVar2;
  iterator iVar3;
  longlong local_20;
  
  local_20 = key;
  pIVar2 = getIndex(this);
  bVar1 = mightIn(this,key);
  if (bVar1) {
    iVar3 = std::
            _Rb_tree<long_long,_std::pair<const_long_long,_unsigned_long>,_std::_Select1st<std::pair<const_long_long,_unsigned_long>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
            ::find(&this->index->_M_t,&local_20);
    bVar1 = (_Rb_tree_header *)iVar3._M_node != &(pIVar2->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DiskTableNode::hasKey(long long key) {
    auto *i = getIndex();
    return mightIn(key) && index->find(key) != i->end();
}